

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::findRegexMatch
          (CoreBroker *this,string *target,InterfaceType type,GlobalHandle handle,uint16_t flags)

{
  HandleManager *this_00;
  BasicHandleInfo *pBVar1;
  BasicHandleInfo *origin;
  ulong uVar2;
  ulong uVar3;
  InterfaceType IVar4;
  ushort uVar5;
  ulong uVar6;
  GlobalHandle *mtch;
  GlobalHandle *pGVar7;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> matches;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> local_108;
  BasicHandleInfo local_f0;
  GlobalHandle local_58;
  GlobalHandle *local_50;
  HandleManager *local_48;
  
  this_00 = &this->handles;
  local_58 = handle;
  pBVar1 = HandleManager::findHandle(this_00,handle);
  local_48 = this_00;
  HandleManager::regexSearch(&local_108,this_00,(string *)target,type);
  local_50 = local_108.
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_108.super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pGVar7 = local_108.
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    IVar4 = PUBLICATION;
    if (type != INPUT) {
      IVar4 = (type == PUBLICATION) * '\x04' + ENDPOINT;
    }
    do {
      origin = HandleManager::findHandle(local_48,*pGVar7);
      if (origin != (BasicHandleInfo *)0x0) {
        if ((pBVar1 != (BasicHandleInfo *)0x0) && (pBVar1->handleType == FILTER)) {
          flags = flags | pBVar1->flags & 0x200;
        }
        uVar5 = flags;
        if ((type == ENDPOINT) &&
           ((pBVar1 == (BasicHandleInfo *)0x0 || (pBVar1->handleType != FILTER)))) {
          uVar5 = flags ^ 2;
        }
        if (pBVar1 == (BasicHandleInfo *)0x0) {
          local_f0.handle = local_58;
          local_f0.local_fed_id.fid = -2000000000;
          local_f0.used = false;
          local_f0.flags = 0;
          local_f0.key._M_dataplus._M_p = (pointer)&local_f0.key.field_2;
          local_f0.key._M_string_length = 0;
          local_f0.key.field_2._M_local_buf[0] = '\0';
          local_f0.type._M_dataplus._M_p = (pointer)&local_f0.type.field_2;
          local_f0.type._M_string_length = 0;
          local_f0.type.field_2._M_local_buf[0] = '\0';
          local_f0.units._M_dataplus._M_p = (pointer)&local_f0.units.field_2;
          local_f0.units._M_string_length = 0;
          local_f0.units.field_2._M_local_buf[0] = '\0';
          local_f0.type_in = &local_f0.type;
          local_f0.type_out = &local_f0.units;
          local_f0.tags.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f0.tags.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f0.tags.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f0.handleType = IVar4;
        }
        else {
          BasicHandleInfo::BasicHandleInfo(&local_f0,pBVar1);
        }
        if (type == FILTER) {
          uVar2 = 0x3e;
        }
        else if (type == INPUT) {
          uVar2 = 0x46;
        }
        else if (type == PUBLICATION) {
          uVar2 = 0x32;
        }
        else {
          uVar2 = 0x5a;
        }
        uVar3 = 0x5a00000000;
        if ((pBVar1 != (BasicHandleInfo *)0x0) &&
           (uVar3 = 0x5a00000000, pBVar1->handleType == FILTER)) {
          uVar3 = 0x3e00000000;
        }
        uVar6 = 0x5a00000000;
        if (type != FILTER) {
          if (type == INPUT) {
            uVar6 = 0x3200000000;
          }
          else {
            uVar6 = uVar3;
            if (type == PUBLICATION) {
              uVar6 = 0x4600000000;
            }
          }
        }
        connectInterfaces(this,origin,(uint)flags,&local_f0,(uint)uVar5,
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )(uVar6 | uVar2));
        CLI::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_f0.tags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.units._M_dataplus._M_p != &local_f0.units.field_2) {
          operator_delete(local_f0.units._M_dataplus._M_p,
                          CONCAT71(local_f0.units.field_2._M_allocated_capacity._1_7_,
                                   local_f0.units.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.type._M_dataplus._M_p != &local_f0.type.field_2) {
          operator_delete(local_f0.type._M_dataplus._M_p,
                          CONCAT71(local_f0.type.field_2._M_allocated_capacity._1_7_,
                                   local_f0.type.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.key._M_dataplus._M_p != &local_f0.key.field_2) {
          operator_delete(local_f0.key._M_dataplus._M_p,
                          CONCAT71(local_f0.key.field_2._M_allocated_capacity._1_7_,
                                   local_f0.key.field_2._M_local_buf[0]) + 1);
        }
      }
      pGVar7 = pGVar7 + 1;
    } while (pGVar7 != local_50);
  }
  if (local_108.super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (GlobalHandle *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::findRegexMatch(const std::string& target,
                                InterfaceType type,
                                GlobalHandle handle,
                                uint16_t flags)
{
    const auto* dest = handles.findHandle(handle);

    try {
        auto matches = handles.regexSearch(target, type);
        for (auto& mtch : matches) {
            const auto* hnd = handles.findHandle(mtch);
            if (hnd == nullptr) {
                continue;
            }
            auto destFlags = flags;
            if (dest != nullptr && dest->handleType == InterfaceType::FILTER) {
                if (checkActionFlag(*dest, clone_flag)) {
                    destFlags |= make_flags(clone_flag);
                    flags |= make_flags(clone_flag);
                }
            }
            if (type == InterfaceType::ENDPOINT &&
                (dest == nullptr || dest->handleType != InterfaceType::FILTER)) {
                destFlags = toggle_flag(destFlags, destination_target);
            }
            connectInterfaces(*hnd,
                              flags,
                              (dest != nullptr) ? *dest :
                                                  BasicHandleInfo(handle, getMatchType(type)),

                              destFlags,
                              std::make_pair(getAction(type),
                                             getMatchAction(type,
                                                            (dest != nullptr) ?
                                                                dest->handleType :
                                                                getMatchType(type))));
        }
    }
    catch (const std::invalid_argument& ia) {
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    fmt::format("invalid regular expression processing {}", ia.what()));
    }
}